

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmisaac.cpp
# Opt level: O2

void isaac_init(isaacctx *ctx,int flag)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  int iVar6;
  uint32_t uVar7;
  uint uVar8;
  uint uVar9;
  uint32_t uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  
  ctx->c = 0;
  ctx->a = 0;
  ctx->b = 0;
  if (flag == 0) {
    uVar1 = 0x1367df5a;
    uVar14 = 0x30609119;
    uVar2 = 0xc4efea1b;
    uVar3 = 0xa51a3c49;
    uVar4 = 0xd92a4a78;
    uVar8 = 0xf421ad8;
    uVar9 = 0xc3163e4b;
    uVar5 = 0x95d90059;
    for (uVar13 = 0; uVar13 < 0x100; uVar13 = uVar13 + 8) {
      uVar1 = uVar1 ^ uVar5 << 0xb;
      iVar6 = uVar8 + uVar1;
      uVar12 = uVar9 >> 2 ^ uVar9 + uVar5;
      uVar4 = uVar4 + uVar12;
      uVar9 = iVar6 * 0x100 ^ iVar6 + uVar9;
      iVar11 = uVar3 + uVar9;
      uVar8 = uVar4 >> 0x10 ^ iVar6 + uVar4;
      uVar2 = uVar2 + uVar8;
      uVar4 = iVar11 * 0x400 ^ iVar11 + uVar4;
      iVar6 = uVar14 + uVar4;
      uVar3 = uVar2 >> 4 ^ iVar11 + uVar2;
      uVar14 = uVar1 + uVar3;
      uVar2 = iVar6 * 0x100 ^ iVar6 + uVar2;
      uVar5 = uVar12 + uVar2;
      uVar1 = uVar5 + uVar14;
      uVar14 = uVar14 >> 9 ^ iVar6 + uVar14;
      uVar9 = uVar9 + uVar14;
      ctx->mem[uVar13] = uVar1;
      ctx->mem[uVar13 + 1] = uVar5;
      ctx->mem[uVar13 + 2] = uVar9;
      ctx->mem[uVar13 + 3] = uVar8;
      ctx->mem[uVar13 + 4] = uVar4;
      ctx->mem[uVar13 + 5] = uVar3;
      ctx->mem[uVar13 + 6] = uVar2;
      ctx->mem[uVar13 + 7] = uVar14;
    }
  }
  else {
    uVar5 = 0x1367df5a;
    uVar14 = 0x30609119;
    uVar1 = 0xc4efea1b;
    uVar2 = 0xa51a3c49;
    uVar3 = 0xd92a4a78;
    uVar4 = 0xf421ad8;
    uVar7 = 0xc3163e4b;
    uVar10 = 0x95d90059;
    for (uVar13 = 0; uVar13 < 0x100; uVar13 = uVar13 + 8) {
      iVar11 = uVar10 + ctx->rsl[uVar13 + 1];
      uVar8 = uVar7 + ctx->rsl[uVar13 + 2];
      uVar12 = iVar11 * 0x800 ^ uVar5 + ctx->rsl[uVar13];
      iVar6 = uVar4 + ctx->rsl[uVar13 + 3] + uVar12;
      uVar9 = uVar8 >> 2 ^ uVar8 + iVar11;
      uVar3 = uVar3 + ctx->rsl[uVar13 + 4] + uVar9;
      uVar8 = iVar6 * 0x100 ^ iVar6 + uVar8;
      iVar11 = uVar2 + ctx->rsl[uVar13 + 5] + uVar8;
      uVar4 = uVar3 >> 0x10 ^ uVar3 + iVar6;
      uVar1 = uVar1 + ctx->rsl[uVar13 + 6] + uVar4;
      uVar3 = iVar11 * 0x400 ^ iVar11 + uVar3;
      iVar6 = uVar14 + ctx->rsl[uVar13 + 7] + uVar3;
      uVar2 = uVar1 >> 4 ^ uVar1 + iVar11;
      uVar12 = uVar12 + uVar2;
      uVar1 = iVar6 * 0x100 ^ iVar6 + uVar1;
      uVar10 = uVar9 + uVar1;
      uVar5 = uVar10 + uVar12;
      uVar14 = uVar12 >> 9 ^ uVar12 + iVar6;
      uVar7 = uVar8 + uVar14;
      ctx->mem[uVar13] = uVar5;
      ctx->mem[uVar13 + 1] = uVar10;
      ctx->mem[uVar13 + 2] = uVar7;
      ctx->mem[uVar13 + 3] = uVar4;
      ctx->mem[uVar13 + 4] = uVar3;
      ctx->mem[uVar13 + 5] = uVar2;
      ctx->mem[uVar13 + 6] = uVar1;
      ctx->mem[uVar13 + 7] = uVar14;
    }
    for (uVar13 = 0; uVar13 < 0x100; uVar13 = uVar13 + 8) {
      iVar11 = uVar10 + ctx->mem[uVar13 + 1];
      uVar8 = uVar7 + ctx->mem[uVar13 + 2];
      uVar12 = iVar11 * 0x800 ^ uVar5 + ctx->mem[uVar13];
      iVar6 = uVar4 + ctx->mem[uVar13 + 3] + uVar12;
      uVar9 = uVar8 >> 2 ^ uVar8 + iVar11;
      uVar3 = uVar3 + ctx->mem[uVar13 + 4] + uVar9;
      uVar8 = iVar6 * 0x100 ^ iVar6 + uVar8;
      iVar11 = uVar2 + ctx->mem[uVar13 + 5] + uVar8;
      uVar4 = uVar3 >> 0x10 ^ uVar3 + iVar6;
      uVar1 = uVar1 + ctx->mem[uVar13 + 6] + uVar4;
      uVar3 = iVar11 * 0x400 ^ iVar11 + uVar3;
      iVar6 = uVar14 + ctx->mem[uVar13 + 7] + uVar3;
      uVar2 = uVar1 >> 4 ^ uVar1 + iVar11;
      uVar12 = uVar12 + uVar2;
      uVar1 = iVar6 * 0x100 ^ iVar6 + uVar1;
      uVar10 = uVar9 + uVar1;
      uVar5 = uVar10 + uVar12;
      uVar14 = uVar12 >> 9 ^ uVar12 + iVar6;
      uVar7 = uVar8 + uVar14;
      ctx->mem[uVar13] = uVar5;
      ctx->mem[uVar13 + 1] = uVar10;
      ctx->mem[uVar13 + 2] = uVar7;
      ctx->mem[uVar13 + 3] = uVar4;
      ctx->mem[uVar13 + 4] = uVar3;
      ctx->mem[uVar13 + 5] = uVar2;
      ctx->mem[uVar13 + 6] = uVar1;
      ctx->mem[uVar13 + 7] = uVar14;
    }
  }
  isaac_gen_group(ctx);
  ctx->cnt = 0x100;
  return;
}

Assistant:

void isaac_init(isaacctx *ctx, int flag)
{
    int i;
    uint32_t a;
    uint32_t b;
    uint32_t c;
    uint32_t d;
    uint32_t e;
    uint32_t f;
    uint32_t g;
    uint32_t h;
    uint32_t *m;
    uint32_t *r;

    ctx->a = ctx->b = ctx->c = 0;
    m = ctx->mem;
    r = ctx->rsl;
    a = b = c = d = e = f = g = h = 0x9e3779b9;         /* the golden ratio */

    /* scramble the initial settings */
    for (i = 0 ; i < 4 ; ++i)
    {
        isaac_mix(a, b, c, d, e, f, g, h);
    }

    if (flag) 
    {
        /* initialize using the contents of ctx->rsl[] as the seed */
        for (i = 0 ; i < ISAAC_RANDSIZ ; i += 8)
        {
            a += r[i];   b += r[i+1]; c += r[i+2]; d += r[i+3];
            e += r[i+4]; f += r[i+5]; g += r[i+6]; h += r[i+7];
            isaac_mix(a, b, c, d, e, f, g, h);
            m[i] = a;   m[i+1] = b; m[i+2] = c; m[i+3] = d;
            m[i+4] = e; m[i+5] = f; m[i+6] = g; m[i+7] = h;
        }

        /* do a second pass to make all of the seed affect all of m */
        for (i = 0 ; i < ISAAC_RANDSIZ ; i += 8)
        {
            a += m[i];   b += m[i+1]; c += m[i+2]; d += m[i+3];
            e += m[i+4]; f += m[i+5]; g += m[i+6]; h += m[i+7];
            isaac_mix(a, b, c, d, e, f, g, h);
            m[i] = a;   m[i+1] = b; m[i+2] = c; m[i+3] = d;
            m[i+4] = e; m[i+5] = f; m[i+6] = g; m[i+7] = h;
        }
    }
    else
    {
        /* initialize using fixed initial settings */
        for (i = 0 ; i < ISAAC_RANDSIZ ; i += 8)
        {
            isaac_mix(a, b, c, d, e, f, g, h);
            m[i] = a; m[i+1] = b; m[i+2] = c; m[i+3] = d;
            m[i+4] = e; m[i+5] = f; m[i+6] = g; m[i+7] = h;
        }
    }

    /* fill in the first set of results */
    isaac_gen_group(ctx);

    /* prepare to use the first set of results */    
    ctx->cnt = ISAAC_RANDSIZ;
}